

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  xmlChar *pxVar1;
  int newSize;
  int indx;
  xmlChar *tmp;
  xmlChar *pxStack_38;
  int buffer_size;
  xmlChar *out;
  xmlChar *buffer;
  xmlChar *cur;
  xmlC14NNormalizationMode mode_local;
  xmlChar *input_local;
  
  if (input == (xmlChar *)0x0) {
    input_local = (xmlChar *)0x0;
  }
  else {
    tmp._4_4_ = 1000;
    pxStack_38 = (xmlChar *)(*xmlMalloc)(1000);
    out = pxStack_38;
    buffer = input;
    if (pxStack_38 == (xmlChar *)0x0) {
      input_local = (xmlChar *)0x0;
    }
    else {
      for (; *buffer != '\0'; buffer = buffer + 1) {
        if ((long)(tmp._4_4_ + -10) < (long)pxStack_38 - (long)out) {
          tmp._4_4_ = xmlGrowCapacity(tmp._4_4_,1,1,1000000000);
          if (tmp._4_4_ < 0) {
            (*xmlFree)(out);
            return (xmlChar *)0x0;
          }
          pxVar1 = (xmlChar *)(*xmlRealloc)(out,(long)tmp._4_4_);
          if (pxVar1 == (xmlChar *)0x0) {
            (*xmlFree)(out);
            return (xmlChar *)0x0;
          }
          pxStack_38 = pxVar1 + ((int)pxStack_38 - (int)out);
          out = pxVar1;
        }
        if ((*buffer == '<') &&
           ((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)))) {
          builtin_memcpy(pxStack_38,"&lt;",4);
          pxStack_38 = pxStack_38 + 4;
        }
        else if ((*buffer == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
          builtin_memcpy(pxStack_38,"&gt;",4);
          pxStack_38 = pxStack_38 + 4;
        }
        else if ((*buffer == '&') &&
                ((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)))) {
          builtin_memcpy(pxStack_38,"&amp;",5);
          pxStack_38 = pxStack_38 + 5;
        }
        else if ((*buffer == '\"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(pxStack_38,"&quot;",6);
          pxStack_38 = pxStack_38 + 6;
        }
        else if ((*buffer == '\t') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(pxStack_38,"&#x9;",5);
          pxStack_38 = pxStack_38 + 5;
        }
        else if ((*buffer == '\n') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(pxStack_38,"&#xA;",5);
          pxStack_38 = pxStack_38 + 5;
        }
        else if ((*buffer == '\r') &&
                ((((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)) ||
                  (mode == XMLC14N_NORMALIZE_COMMENT)) || (mode == XMLC14N_NORMALIZE_PI)))) {
          builtin_memcpy(pxStack_38,"&#xD;",5);
          pxStack_38 = pxStack_38 + 5;
        }
        else {
          *pxStack_38 = *buffer;
          pxStack_38 = pxStack_38 + 1;
        }
      }
      *pxStack_38 = '\0';
      input_local = out;
    }
  }
  return input_local;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = xmlMalloc(buffer_size);
    if (buffer == NULL)
        return (NULL);
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            xmlChar *tmp;
            int indx = out - buffer;
            int newSize;

            newSize = xmlGrowCapacity(buffer_size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
                xmlFree(buffer);
                return(NULL);
            }
            tmp = xmlRealloc(buffer, newSize);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            buffer_size = newSize;
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}